

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_predicate_push_response_headers_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int iVar2;
  
  if (stream != (nghttp2_stream *)0x0) {
    iVar1 = session_is_closing(session);
    iVar2 = -0x212;
    if ((((iVar1 == 0) && (iVar2 = -0x200, (stream->shut_flags & 2) == 0)) &&
        (iVar2 = -0x1f9, session->server != '\0')) && (stream->state == NGHTTP2_STREAM_RESERVED)) {
      iVar2 = -0x204;
      if ((session->goaway_flags & 8) == 0) {
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  return -0x1fe;
}

Assistant:

static int
session_predicate_push_response_headers_send(nghttp2_session *session,
                                             nghttp2_stream *stream) {
  int rv;
  /* TODO Should disallow HEADERS if GOAWAY has already been issued? */
  rv = session_predicate_for_stream_send(session, stream);
  if (rv != 0) {
    return rv;
  }
  assert(stream);
  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }
  if (stream->state != NGHTTP2_STREAM_RESERVED) {
    return NGHTTP2_ERR_PROTO;
  }
  if (session->goaway_flags & NGHTTP2_GOAWAY_RECV) {
    return NGHTTP2_ERR_START_STREAM_NOT_ALLOWED;
  }
  return 0;
}